

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O0

unique_ptr<S2Shape,_std::default_delete<S2Shape>_> __thiscall
s2shapeutil::VectorShapeFactory::operator[](VectorShapeFactory *this,int shape_id)

{
  element_type *this_00;
  reference pvVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  int shape_id_local;
  VectorShapeFactory *this_local;
  
  this_00 = std::
            __shared_ptr_access<std::vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<std::vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(CONCAT44(in_register_00000034,shape_id) + 8));
  pvVar1 = std::
           vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
           ::operator[](this_00,(long)in_EDX);
  std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>::unique_ptr
            ((unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)this,pvVar1);
  return (__uniq_ptr_data<S2Shape,_std::default_delete<S2Shape>,_true,_true>)
         (__uniq_ptr_data<S2Shape,_std::default_delete<S2Shape>,_true,_true>)this;
}

Assistant:

unique_ptr<S2Shape> VectorShapeFactory::operator[](int shape_id) const {
  return std::move((*shared_shapes_)[shape_id]);
}